

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::DrawWaiting(DBaseStatusBar *this)

{
  int iVar1;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char conbuff [64];
  
  this_00 = screen;
  font = SmallFont;
  if (netgame) {
    pcVar3 = &DAT_017e5f44;
    lVar4 = 0;
    pcVar5 = (char *)0x0;
    do {
      if ((playeringame[lVar4] == true) && (*pcVar3 == '\x01')) {
        if (pcVar5 == (char *)0x0) {
          builtin_strncpy(conbuff + 8,"for:",5);
          builtin_strncpy(conbuff,"Waiting ",8);
          pcVar5 = conbuff + 0xc;
        }
        *pcVar5 = ' ';
        pcVar5[1] = (char)lVar4 + '1';
        pcVar5[2] = '\0';
        pcVar5 = pcVar5 + 2;
      }
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 0x2a0;
    } while (lVar4 != 8);
    if (pcVar5 != (char *)0x0) {
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar2 = FFont::StringWidth(SmallFont,(BYTE *)conbuff);
      DCanvas::DrawText((DCanvas *)this_00,font,8,(iVar1 - iVar2 * CleanXfac) / 2,
                        CleanYfac * SmallFont->FontHeight,conbuff,0x40001393,1,0);
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawWaiting () const
{
	int i;
	char conbuff[64], *buff_p;

	if (!netgame)
		return;

	buff_p = NULL;
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i] && players[i].waiting)
		{
			if (buff_p == NULL)
			{
				strcpy (conbuff, "Waiting for:");
				buff_p = conbuff + 12;
			}
			*buff_p++ = ' ';
			*buff_p++ = '1' + i;
			*buff_p = 0;
		}
	}

	if (buff_p != NULL)
	{
		screen->DrawText (SmallFont, CR_ORANGE, 
			(screen->GetWidth() - SmallFont->StringWidth (conbuff)*CleanXfac) / 2,
			SmallFont->GetHeight()*CleanYfac, conbuff, DTA_CleanNoMove, true, TAG_DONE);
		BorderTopRefresh = screen->GetPageCount ();
	}
}